

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int i_2;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  int i;
  long lVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  int pitch;
  ulong local_38d0;
  void *m_pixels;
  SDL_Event event;
  CHIP8 emulator;
  uint pixels [2048];
  
  if (argc < 2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"No ROM specified!\nUsage:\t");
    poVar5 = std::operator<<(poVar5,*argv);
    poVar5 = std::operator<<(poVar5," <ROM path>");
    std::endl<char,std::char_traits<char>>(poVar5);
    return 1;
  }
  CHIP8::CHIP8(&emulator);
  CHIP8::initialise(&emulator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pixels,argv[1],(allocator<char> *)&event.common);
  bVar1 = CHIP8::loadROM(&emulator,(string *)pixels);
  std::__cxx11::string::~string((string *)pixels);
  if (bVar1) {
    iVar2 = SDL_Init(0xf231);
    if (iVar2 < 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Couldn\'t initialise SDL!\n");
      pcVar6 = (char *)SDL_GetError();
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      lVar7 = SDL_CreateWindow("CHIP8-Emulator",0x1fff0000,0x1fff0000,0x400,0x300,0x20);
      if (lVar7 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Couldn\'t create Window!\n");
        pcVar6 = (char *)SDL_GetError();
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
        lVar7 = SDL_CreateRenderer(lVar7,0xffffffffffffffff,0);
        if (lVar7 == 0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Couldn\'t create Renderer!\n");
          pcVar6 = (char *)SDL_GetError();
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        else {
          lVar8 = SDL_CreateTexture(lVar7,0x16362004,1,0x40,0x20);
          if (lVar8 != 0) {
            uVar3 = SDL_GetTicks();
            uVar4 = SDL_GetTicks();
            uVar10 = (ulong)uVar4;
            lVar11 = 0;
            local_38d0 = (ulong)uVar3;
            do {
              while( true ) {
                while( true ) {
                  while (iVar2 = SDL_PollEvent(), iVar2 == 0) {
                    CHIP8::emulateCycle(&emulator);
                    if (emulator.drawFlag == true) {
                      iVar2 = SDL_LockTexture(lVar8,0,&m_pixels,&pitch);
                      if (iVar2 < 0) {
                        poVar5 = std::operator<<((ostream *)&std::cerr,"Couldn\'t lock texture!\n");
                        pcVar6 = (char *)SDL_GetError();
                        poVar5 = std::operator<<(poVar5,pcVar6);
                        std::endl<char,std::char_traits<char>>(poVar5);
                      }
                      for (lVar9 = 0; lVar9 != 0x800; lVar9 = lVar9 + 1) {
                        pixels[lVar9] = -(uint)emulator.graphics[lVar9] | 0xff000000;
                      }
                      memcpy(m_pixels,pixels,(long)pitch << 5);
                      SDL_UnlockTexture(lVar8);
                      SDL_RenderClear(lVar7);
                      SDL_RenderCopy(lVar7,lVar8,0,0);
                      SDL_RenderPresent(lVar7);
                      emulator.drawFlag = false;
                      uVar3 = SDL_GetTicks();
                      if ((long)(uVar3 - uVar10) < 0x10) {
                        iVar2 = SDL_GetTicks();
                        SDL_Delay(((int)uVar10 - iVar2) + 0x10);
                      }
                      uVar3 = SDL_GetTicks();
                      uVar4 = SDL_GetTicks();
                      poVar5 = std::operator<<((ostream *)&std::cerr,"Avg. FPS: ");
                      fVar12 = (float)lVar11 / ((float)(long)(uVar4 - local_38d0) / 1000.0);
                      poVar5 = (ostream *)
                               std::ostream::operator<<
                                         (poVar5,(float)(~-(uint)(2e+06 < fVar12) & (uint)fVar12));
                      std::operator<<(poVar5,"\r");
                      uVar10 = (ulong)uVar3;
                      lVar11 = lVar11 + 1;
                    }
                    if (emulator.beepFlag == true) {
                      poVar5 = std::operator<<((ostream *)&std::cerr,"Beep!!                    \r")
                      ;
                      std::endl<char,std::char_traits<char>>(poVar5);
                      emulator.beepFlag = false;
                    }
                  }
                  if (event.type != 0x300) break;
                  if (event.window.data2 == 0x1b) goto LAB_0010282f;
                  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
                    if (event.window.data2 == (uint)SDLKeys[lVar9]) {
                      emulator.key[lVar9] = '\x01';
                    }
                  }
                }
                if (event.type != 0x301) break;
                for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
                  if (event.window.data2 == (uint)SDLKeys[lVar9]) {
                    emulator.key[lVar9] = '\0';
                  }
                }
              }
            } while (event.type != 0x100);
LAB_0010282f:
            exit(0);
          }
          poVar5 = std::operator<<((ostream *)&std::cerr,"Couldn\'t create texture!\n");
          pcVar6 = (char *)SDL_GetError();
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
    }
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv){

    if(argc < 2){
        std::cerr << "No ROM specified!\nUsage:\t" << argv[0] << " <ROM path>" << std::endl;
        return 1;
    }

    CHIP8 emulator;

    emulator.initialise();

    if (!emulator.loadROM(argv[1])){
        exit(1);
    }

    SDL_Window   *window   = NULL;
    SDL_Renderer *renderer = NULL;
    SDL_Texture  *texture  = NULL;

    if (SDL_Init(SDL_INIT_EVERYTHING) < 0){
        std::cerr << "Couldn't initialise SDL!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    window = SDL_CreateWindow("CHIP8-Emulator",
                SDL_WINDOWPOS_UNDEFINED,
                SDL_WINDOWPOS_UNDEFINED,
                WINDOW_WIDTH, WINDOW_HEIGHT,
                SDL_WINDOW_RESIZABLE);

    if (window == NULL){
        std::cerr << "Couldn't create Window!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    renderer = SDL_CreateRenderer(window, -1, 0);

    if (renderer == NULL){
        std::cerr << "Couldn't create Renderer!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    texture = SDL_CreateTexture(renderer,
                    SDL_PIXELFORMAT_ARGB8888,
                    SDL_TEXTUREACCESS_STREAMING,
                    GRAPHICS_WIDTH, GRAPHICS_HEIGHT);

    if(texture == NULL){
        std::cerr << "Couldn't create texture!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    unsigned int pixels[GRAPHICS_HEIGHT * GRAPHICS_WIDTH];
    int  timer = 0;
    long start = SDL_GetTicks(); // For measuring average FPS
    long start_per_frame = SDL_GetTicks(); // For capping FPS
    long countedFrames = 0;

    while(true){

        SDL_Event event;

        while(SDL_PollEvent(&event)) {
            if (event.type == SDL_QUIT)
                exit(0);

            if (event.type == SDL_KEYDOWN){
                if (event.key.keysym.sym == SDLK_ESCAPE)
                    exit(0);

                for (int i = 0; i < TOTAL_KEYS; ++i){
                    if (event.key.keysym.sym == SDLKeys[i]){
                        emulator.key[i] = 1;
                    }
                }
            }

            if (event.type == SDL_KEYUP){
                for (int i = 0; i < TOTAL_KEYS; ++i){
                    if (event.key.keysym.sym == SDLKeys[i]){
                        emulator.key[i] = 0;
                    }
                }
            }
        }

        if (timer == CLOCK_DELAYER){
            emulator.emulateCycle();
            timer = 0;
        }

        else {
            timer += 1;
        }


        int pitch;
        void* m_pixels;


        if (emulator.drawFlag){

            if(SDL_LockTexture(texture, NULL, (void **)&m_pixels, &pitch) < 0){
                std::cerr << "Couldn't lock texture!\n" << SDL_GetError() << std::endl;
            }

            for (int i = 0; i < (GRAPHICS_HEIGHT * GRAPHICS_WIDTH); ++i){
                pixels[i] = ((0x00FFFFFF *  emulator.graphics[i]) | 0xFF000000);
            }

            memcpy(m_pixels, pixels, GRAPHICS_HEIGHT*pitch);
            SDL_UnlockTexture(texture);

            SDL_RenderClear(renderer);
            SDL_RenderCopy(renderer,texture,NULL,NULL);
            SDL_RenderPresent(renderer);


            emulator.drawFlag = false;

            if((1000 / FPS_CAP) > (SDL_GetTicks() - start_per_frame)){
                SDL_Delay( (1000 / FPS_CAP) - (SDL_GetTicks() - start_per_frame));
            }
            start_per_frame = SDL_GetTicks();
            float avgFPS = countedFrames / ( (SDL_GetTicks() - start) / 1000.f );
			if( avgFPS > 2000000 ){
				avgFPS = 0;
			}
            ++countedFrames;

            std::cerr << "Avg. FPS: " << avgFPS << "\r";
        }
        if (emulator.beepFlag){
            std::cerr << "Beep!!                    \r" << std::endl;
            //TODO

            emulator.beepFlag = false;
        }

    }

    return 0;
}